

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::OutputFile::updatePreviewImage(OutputFile *this,PreviewRgba *newPixels)

{
  pthread_mutex_t *__mutex;
  PreviewRgba *pPVar1;
  OStream *pOVar2;
  int iVar3;
  TypedAttribute<Imf_3_4::PreviewImage> *pTVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ostream *poVar6;
  LogicExc *this_00;
  uint uVar7;
  ulong uVar8;
  stringstream _iex_throw_s;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->_data->previewPosition != 0) {
    pTVar4 = Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>>
                       (&this->_data->header,"preview");
    uVar7 = (pTVar4->_value)._height * (pTVar4->_value)._width;
    if (0 < (int)uVar7) {
      pPVar1 = (pTVar4->_value)._pixels;
      uVar8 = 0;
      do {
        pPVar1[uVar8] = newPixels[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    iVar3 = (*this->_data->_streamData->os->_vptr_OStream[3])();
    pOVar2 = this->_data->_streamData->os;
    (*pOVar2->_vptr_OStream[4])(pOVar2,this->_data->previewPosition);
    (*(pTVar4->super_Attribute)._vptr_Attribute[4])
              (pTVar4,this->_data->_streamData->os,(ulong)(uint)this->_data->version);
    pOVar2 = this->_data->_streamData->os;
    (*pOVar2->_vptr_OStream[4])(pOVar2,CONCAT44(extraout_var,iVar3));
    pthread_mutex_unlock(__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Cannot update preview image pixels. File \"",0x2a);
  pcVar5 = OStream::fileName(this->_data->_streamData->os);
  poVar6 = std::operator<<(local_198,pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\" does not contain a preview image.",0x23);
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::LogicExc::LogicExc(this_00,asStack_1a8);
  __cxa_throw(this_00,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
}

Assistant:

void
OutputFile::updatePreviewImage (const PreviewRgba newPixels[])
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    if (_data->previewPosition <= 0)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Cannot update preview image pixels. "
            "File \""
                << fileName ()
                << "\" does not "
                   "contain a preview image.");

    //
    // Store the new pixels in the header's preview image attribute.
    //

    PreviewImageAttribute& pia =
        _data->header.typedAttribute<PreviewImageAttribute> ("preview");

    PreviewImage& pi        = pia.value ();
    PreviewRgba*  pixels    = pi.pixels ();
    int           numPixels = pi.width () * pi.height ();

    for (int i = 0; i < numPixels; ++i)
        pixels[i] = newPixels[i];

    //
    // Save the current file position, jump to the position in
    // the file where the preview image starts, store the new
    // preview image, and jump back to the saved file position.
    //

    uint64_t savedPosition = _data->_streamData->os->tellp ();

    try
    {
        _data->_streamData->os->seekp (_data->previewPosition);
        pia.writeValueTo (*_data->_streamData->os, _data->version);
        _data->_streamData->os->seekp (savedPosition);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Cannot update preview image pixels for "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}